

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

JSON_Value * json_value_init_null(void)

{
  JSON_Value *new_value;
  
  new_value = (JSON_Value *)(*parson_malloc)(0x20);
  if (new_value == (JSON_Value *)0x0) {
    new_value = (JSON_Value *)0x0;
  }
  else {
    new_value->parent = (JSON_Value *)0x0;
    new_value->type = 1;
  }
  return new_value;
}

Assistant:

JSON_Value * json_value_init_null(void) {
    JSON_Value *new_value = (JSON_Value*)parson_malloc(sizeof(JSON_Value));
    if (!new_value) {
        return NULL;
    }
    new_value->parent = NULL;
    new_value->type = JSONNull;
    return new_value;
}